

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_https.hpp
# Opt level: O0

int __thiscall
SimpleWeb::Server<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::accept
          (Server<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_> *this,int __fd,
          sockaddr *__addr,socklen_t *__addr_len)

{
  int extraout_EAX;
  context *args_1;
  pointer this_00;
  element_type *peVar1;
  pointer this_01;
  lowest_layer_type *peer;
  type local_48;
  undefined1 local_20 [8];
  shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection>
  connection;
  Server<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_> *this_local;
  
  connection.
  super___shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  args_1 = (context *)
           std::__shared_ptr_access<asio::io_context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<asio::io_context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&(this->
                         super_ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>
                         ).io_service);
  ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>::
  create_connection<asio::io_context&,asio::ssl::context&>
            ((ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>> *)local_20,
             (io_context *)this,args_1);
  this_00 = std::
            unique_ptr<asio::basic_socket_acceptor<asio::ip::tcp>,_std::default_delete<asio::basic_socket_acceptor<asio::ip::tcp>_>_>
            ::operator->(&(this->
                          super_ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>
                          ).acceptor);
  peVar1 = std::
           __shared_ptr_access<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_20);
  this_01 = std::
            unique_ptr<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>,_std::default_delete<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>_>
            ::operator->(&peVar1->socket);
  peer = asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>::lowest_layer(this_01);
  local_48.this = this;
  std::
  shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection>
  ::shared_ptr(&local_48.connection,
               (shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection>
                *)local_20);
  asio::basic_socket_acceptor<asio::ip::tcp>::
  async_accept<asio::ip::tcp,SimpleWeb::Server<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>::accept()::_lambda(std::error_code_const&)_1_>
            (this_00,peer,&local_48,(type *)0x0);
  Server<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>::accept()::
  {lambda(std::error_code_const&)#1}::~error_code((_lambda_std__error_code_const___1_ *)&local_48);
  std::
  shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection>
  ::~shared_ptr((shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection>
                 *)local_20);
  return extraout_EAX;
}

Assistant:

void accept() override {
      auto connection = create_connection(*io_service, context);

      acceptor->async_accept(connection->socket->lowest_layer(), [this, connection](const error_code &ec) {
        auto lock = connection->handler_runner->continue_lock();
        if(!lock)
          return;

        if(ec != asio::error::operation_aborted)
          this->accept();

        auto session = std::make_shared<Session>(config.max_request_streambuf_size, connection);

        if(!ec) {
          asio::ip::tcp::no_delay option(true);
          error_code ec;
          session->connection->socket->lowest_layer().set_option(option, ec);

          session->connection->set_timeout(config.timeout_request);
          session->connection->socket->async_handshake(asio::ssl::stream_base::server, [this, session](const error_code &ec) {
            session->connection->cancel_timeout();
            auto lock = session->connection->handler_runner->continue_lock();
            if(!lock)
              return;
            if(!ec)
              this->read(session);
            else if(this->on_error)
              this->on_error(session->request, ec);
          });
        }
        else if(this->on_error)
          this->on_error(session->request, ec);
      });
    }